

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall el::Logger::flush(Logger *this)

{
  char cVar1;
  undefined8 uVar2;
  EnumType lIndex;
  uint local_3c;
  Logger *local_38;
  uint *puStack_30;
  code *local_28;
  code *pcStack_20;
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  puStack_30 = &local_3c;
  local_3c = 2;
  pcStack_20 = base::utils::std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/easylogging++/easylogging++.cc:604:38)>
               ::_M_invoke;
  local_28 = base::utils::std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/BrychDaneel[P]WgForgeTrains/libs/easylogging++/easylogging++.cc:604:38)>
             ::_M_manager;
  local_38 = this;
  do {
    if (local_28 == (code *)0x0) {
      uVar2 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar2);
    }
    cVar1 = (*pcStack_20)(&local_38);
  } while ((cVar1 == '\0') && (local_3c = local_3c * 2, local_3c < 0x81));
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  return;
}

Assistant:

void Logger::flush(void) {
  ELPP_INTERNAL_INFO(3, "Flushing logger [" << m_id << "] all levels");
  base::threading::ScopedLock scopedLock(lock());
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    flush(LevelHelper::castFromInt(lIndex), nullptr);
    return false;
  });
}